

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

void cppcms::http::context::dispatch
               (shared_ptr<cppcms::application_specific_pool> *pool,
               shared_ptr<cppcms::http::context> *self,string *url)

{
  bool bVar1;
  byte bVar2;
  level_type lVar3;
  ostream *poVar4;
  response *this;
  bool in_stack_000000d7;
  intrusive_ptr<cppcms::application> app;
  application *in_stack_ffffffffffffff10;
  shared_ptr<cppcms::http::context> *in_stack_ffffffffffffff18;
  string *this_00;
  application *in_stack_ffffffffffffff20;
  shared_ptr<cppcms::http::context> local_a0;
  undefined4 local_8c;
  string local_88 [24];
  context *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  byte bVar5;
  message local_60 [64];
  intrusive_ptr<cppcms::application> local_20 [4];
  
  std::
  __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x3a23dc);
  std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x3a23ee);
  service((context *)0x3a23f6);
  application_specific_pool::get
            ((application_specific_pool *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
             (service *)in_stack_ffffffffffffff90);
  bVar1 = booster::intrusive_ptr<cppcms::application>::operator!(local_20);
  if (bVar1) {
    bVar5 = 0;
    lVar3 = booster::log::logger::instance();
    bVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if ((bVar2 & 1) != 0) {
      booster::log::message::message
                (local_60,error,"cppcms",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/http_context.cpp"
                 ,0x145);
      bVar5 = 1;
      poVar4 = (ostream *)booster::log::message::out();
      poVar4 = std::operator<<(poVar4,"Cound fetch synchronous application from a pool");
      std::ios::operator_cast_to_bool(poVar4 + *(long *)(*(long *)poVar4 + -0x18));
    }
    if ((bVar5 & 1) != 0) {
      booster::log::message::~message(local_60);
    }
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3a2501);
    this = response((context *)0x3a2509);
    this_00 = local_88;
    std::__cxx11::string::string(this_00);
    http::response::make_error_response
              (this,(int)((ulong)this_00 >> 0x20),(string *)in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_88);
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3a254c);
    complete_response(in_stack_ffffffffffffff90);
    local_8c = 1;
  }
  else {
    in_stack_ffffffffffffff10 = booster::intrusive_ptr<cppcms::application>::operator->(local_20);
    std::shared_ptr<cppcms::http::context>::shared_ptr
              ((shared_ptr<cppcms::http::context> *)in_stack_ffffffffffffff10,&local_a0);
    application::assign_context(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x3a2615);
    dispatch((intrusive_ptr<cppcms::application> *)url,(string *)app.p_,in_stack_000000d7);
    local_8c = 0;
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void context::dispatch(booster::shared_ptr<application_specific_pool> const &pool,booster::shared_ptr<context> const &self,std::string const &url)
{
	booster::intrusive_ptr<application> app = pool->get(self->service());
	if(!app) {
		BOOSTER_ERROR("cppcms") << "Cound fetch synchronous application from a pool";
		self->response().make_error_response(http::response::internal_server_error);
		self->complete_response();
		return;
	}
	app->assign_context(self);
	dispatch(app,url,true);
}